

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

_tExecReaction __thiscall yactfr::internal::Vm::_execEndReadOptSIntSel(Vm *this,Instr *instr)

{
  OptionalWithSignedIntegerSelectorEndElement *elem;
  
  elem = &(this->_pos).elems.optSIntSelEnd;
  _setDataElemFromInstr<yactfr::OptionalWithSignedIntegerSelectorEndElement>(elem,instr);
  _updateItForUser(this,(Element *)elem);
  VmPos::setParentStateAndStackPop(&this->_pos);
  return Stop;
}

Assistant:

Vm::_tExecReaction Vm::_execEndReadOptSIntSel(const Instr& instr)
{
    this->_setDataElemFromInstr(_pos.elems.optSIntSelEnd, instr);
    this->_updateItForUser(_pos.elems.optSIntSelEnd);
    _pos.setParentStateAndStackPop();
    return _tExecReaction::Stop;
}